

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O0

void __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,
          HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *src)

{
  HItem *index_00;
  uint uVar1;
  SizeT SVar2;
  SizeT SVar3;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar4;
  char16_t *key;
  String<char16_t> local_50;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *local_40;
  HItem *storage_item;
  SizeT *index;
  HItem *src_end;
  HItem *src_item;
  HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
  *pHStack_18;
  SizeT n_size;
  HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *src_local;
  HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this_local;
  
  pHStack_18 = &src->
                super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
  ;
  src_local = this;
  SVar2 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ::Size(&this->
                  super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                );
  SVar3 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ::Size(pHStack_18);
  src_item._4_4_ = SVar2 + SVar3;
  pHVar4 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           ::First(pHStack_18);
  src_end = pHVar4;
  SVar2 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ::Size(pHStack_18);
  uVar1 = src_item._4_4_;
  index = (SizeT *)(pHVar4 + SVar2);
  SVar2 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ::Capacity(&this->
                      super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                    );
  if (SVar2 < uVar1) {
    HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
    ::resize(&this->
              super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ,src_item._4_4_);
  }
  for (; src_end < index; src_end = src_end + 1) {
    if (src_end->Hash != 0) {
      key = String<char16_t>::First(&src_end->Key);
      SVar2 = String<char16_t>::Length(&src_end->Key);
      local_40 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                 ::find(&this->
                         super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                        ,(SizeT **)&storage_item,key,SVar2,src_end->Hash);
      index_00 = storage_item;
      if (local_40 == (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)0x0) {
        String<char16_t>::String(&local_50,&src_end->Key);
        local_40 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                   ::insert(&this->
                             super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                            ,(SizeT *)index_00,&local_50,src_end->Hash);
        String<char16_t>::~String(&local_50);
        Memory::Initialize<Qentem::Value<char16_t>>(&local_40->Value);
      }
      Value<char16_t>::operator=(&local_40->Value,&src_end->Value);
    }
  }
  return;
}

Assistant:

void operator+=(const HArray &src) {
        const SizeT  n_size   = (Size() + src.Size());
        const HItem *src_item = src.First();
        const HItem *src_end  = src_item + src.Size();

        if (n_size > Capacity()) {
            resize(n_size);
        }

        while (src_item < src_end) {
            if (src_item->Hash != 0) {
                SizeT *index;
                HItem *storage_item = find(index, src_item->Key.First(), src_item->Key.Length(), src_item->Hash);

                if (storage_item == nullptr) {
                    storage_item = insert(index, Key_T{src_item->Key}, src_item->Hash);
                    Memory::Initialize(&(storage_item->Value));
                }

                storage_item->Value = src_item->Value;
            }

            ++src_item;
        }
    }